

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::activateHighlightedWindow(QMdiAreaPrivate *this)

{
  QPointer<QMdiSubWindow> *pQVar1;
  Data *pDVar2;
  long lVar3;
  QObject *child;
  
  lVar3 = (long)this->indexToHighlighted;
  if (-1 < lVar3) {
    if ((this->tabToPreviousTimer).m_id == Invalid) {
      pQVar1 = (this->childWindows).d.ptr;
      pDVar2 = pQVar1[lVar3].wp.d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        child = (QObject *)0x0;
      }
      else {
        child = pQVar1[lVar3].wp.value;
      }
    }
    else {
      child = (QObject *)nextVisibleSubWindow(this,-1,ActivationHistoryOrder,-1,-1);
    }
    activateWindow(this,(QMdiSubWindow *)child);
    hideRubberBand(this);
    return;
  }
  return;
}

Assistant:

void QMdiAreaPrivate::activateHighlightedWindow()
{
    if (indexToHighlighted < 0)
        return;

    Q_ASSERT(indexToHighlighted < childWindows.size());
    if (tabToPreviousTimer.isActive())
        activateWindow(nextVisibleSubWindow(-1, QMdiArea::ActivationHistoryOrder));
    else
        activateWindow(childWindows.at(indexToHighlighted));
#if QT_CONFIG(rubberband)
    hideRubberBand();
#endif
}